

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O1

void __thiscall QCompleter::setWidget(QCompleter *this,QWidget *widget)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  undefined8 uVar4;
  QWidget *pQVar5;
  
  lVar1 = *(long *)&this->field_0x8;
  lVar2 = *(long *)(lVar1 + 0x78);
  if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
    pQVar5 = (QWidget *)0x0;
  }
  else {
    pQVar5 = *(QWidget **)(lVar1 + 0x80);
  }
  if (pQVar5 != widget) {
    if (((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) && (*(long *)(lVar1 + 0x80) != 0)) {
      QObject::removeEventFilter(*(QObject **)(lVar1 + 0x80));
    }
    if (widget == (QWidget *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = QtSharedPointer::ExternalRefCountData::getAndRef(&widget->super_QObject);
    }
    piVar3 = *(int **)(lVar1 + 0x78);
    *(undefined8 *)(lVar1 + 0x78) = uVar4;
    *(QWidget **)(lVar1 + 0x80) = widget;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        operator_delete(piVar3);
      }
    }
    if (((*(long *)(lVar1 + 0x78) != 0) && (*(int *)(*(long *)(lVar1 + 0x78) + 4) != 0)) &&
       (*(long *)(lVar1 + 0x80) != 0)) {
      QObject::installEventFilter(*(QObject **)(lVar1 + 0x80));
    }
    if (*(QWidget **)(lVar1 + 0x90) != (QWidget *)0x0) {
      QWidget::hide(*(QWidget **)(lVar1 + 0x90));
      if ((*(long *)(lVar1 + 0x78) == 0) || (*(int *)(*(long *)(lVar1 + 0x78) + 4) == 0)) {
        pQVar5 = (QWidget *)0x0;
      }
      else {
        pQVar5 = *(QWidget **)(lVar1 + 0x80);
      }
      QWidget::setFocusProxy(*(QWidget **)(lVar1 + 0x90),pQVar5);
      return;
    }
  }
  return;
}

Assistant:

void QCompleter::setWidget(QWidget *widget)
{
    Q_D(QCompleter);
    if (widget == d->widget)
        return;

    if (d->widget)
        d->widget->removeEventFilter(this);
    d->widget = widget;
    if (d->widget)
        d->widget->installEventFilter(this);

    if (d->popup) {
        d->popup->hide();
        d->popup->setFocusProxy(d->widget);
    }
}